

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O0

ssize_t __thiscall qpdf::pl::Count::write(Count *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  Pipeline *pPVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  size_t len_local;
  uchar *buf_local;
  Count *this_local;
  
  if (__buf != (void *)0x0) {
    if (this->str == (string *)0x0) {
      this->count = (long)__buf + this->count;
      if ((this->pass_immediately_to_next & 1U) != 0) {
        pPVar2 = Pipeline::next(&this->super_Pipeline);
        iVar1 = (*pPVar2->_vptr_Pipeline[2])(pPVar2,CONCAT44(in_register_00000034,__fd),__buf);
        this = (Count *)CONCAT44(extraout_var,iVar1);
      }
    }
    else {
      this = (Count *)std::__cxx11::string::append
                                ((char *)this->str,CONCAT44(in_register_00000034,__fd));
    }
  }
  return (ssize_t)this;
}

Assistant:

void
        write(unsigned char const* buf, size_t len) final
        {
            if (len) {
                if (str) {
                    str->append(reinterpret_cast<char const*>(buf), len);
                    return;
                }
                count += static_cast<qpdf_offset_t>(len);
                if (pass_immediately_to_next) {
                    next()->write(buf, len);
                }
            }
        }